

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateFunctionContextAccess(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  ModuleData *pMVar1;
  TypeBase *pTVar2;
  int iVar3;
  ExprError *pEVar4;
  ScopeData *pSVar5;
  ExprBase *pEVar6;
  IdentifierLookupResult *pIVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar8;
  ExprBase *pEVar9;
  VariableData *variable;
  InplaceStr IVar10;
  
  if (function->scope->ownerType != (TypeBase *)0x0) {
    pEVar4 = anon_unknown.dwarf_11255e::ReportExpected
                       (ctx,source,function->contextType,
                        "ERROR: member function can\'t be called without a class instance");
    return &pEVar4->super_ExprBase;
  }
  pSVar5 = (ScopeData *)&ctx->scope;
  while ((pSVar5 = pSVar5->scope, pSVar5 != (ScopeData *)0x0 &&
         (pSVar5->ownerType == (TypeBase *)0x0))) {
    if (pSVar5->ownerFunction == function) {
      pEVar6 = CreateVariableAccess(ctx,source,function->contextArgument,true);
      return pEVar6;
    }
  }
  pEVar6 = function->declaration;
  if ((pEVar6 == (ExprBase *)0x0) || (pEVar6->typeID != 0x24)) {
    pEVar6 = (ExprBase *)0x0;
  }
  if (pEVar6 == (ExprBase *)0x0) {
    if (function->coroutine == true) {
      uVar8 = function->functionIndex;
      pMVar1 = function->importModule;
      if (pMVar1 != (ModuleData *)0x0) {
        uVar8 = (uVar8 - pMVar1->startingFunctionIndex) + pMVar1->importedFunctionCount;
      }
      IVar10 = GetFunctionContextVariableName(ctx,function,uVar8);
      uVar8 = NULLC::GetStringHash(IVar10.begin,IVar10.end);
      pIVar7 = anon_unknown.dwarf_11255e::LookupObjectByName(ctx,uVar8);
      if ((pIVar7 == (IdentifierLookupResult *)0x0) ||
         (variable = pIVar7->variable, variable == (VariableData *)0x0)) {
        variable = (VariableData *)0x0;
      }
      if (variable != (VariableData *)0x0) {
        pEVar6 = CreateVariableAccess(ctx,source,variable,true);
        if ((pEVar6 == (ExprBase *)0x0) || (pEVar9 = pEVar6, pEVar6->typeID != 0x22)) {
          pEVar9 = (ExprBase *)0x0;
        }
        if (pEVar9 == (ExprBase *)0x0) {
          return pEVar6;
        }
        if ((VariableData *)pEVar9[1]._vptr_ExprBase != variable) {
          __assert_fail("access->variable == variable",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0xfb7,
                        "ExprBase *CreateFunctionContextAccess(ExpressionContext &, SynBase *, FunctionData *)"
                       );
        }
        goto LAB_001e2f27;
      }
    }
  }
  else {
    variable = (VariableData *)pEVar6[2].source;
    if (variable != (VariableData *)0x0) {
      pEVar6 = CreateVariableAccess(ctx,source,variable,true);
      if ((pEVar6 == (ExprBase *)0x0) || (pEVar9 = pEVar6, pEVar6->typeID != 0x22)) {
        pEVar9 = (ExprBase *)0x0;
      }
      if (pEVar9 == (ExprBase *)0x0) {
        return pEVar6;
      }
      if ((VariableData *)pEVar9[1]._vptr_ExprBase != variable) {
        __assert_fail("access->variable == contextVariable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0xf9e,
                      "ExprBase *CreateFunctionContextAccess(ExpressionContext &, SynBase *, FunctionData *)"
                     );
      }
LAB_001e2f27:
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      ExprFunctionContextAccess::ExprFunctionContextAccess
                ((ExprFunctionContextAccess *)CONCAT44(extraout_var,iVar3),source,pEVar9->type,
                 function,variable);
      return &((ExprFunctionContextAccess *)CONCAT44(extraout_var,iVar3))->super_ExprBase;
    }
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
  pTVar2 = function->contextType;
  pEVar6->typeID = 9;
  pEVar6->source = source;
  pEVar6->type = pTVar2;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f65c8;
  return pEVar6;
}

Assistant:

ExprBase* CreateFunctionContextAccess(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	if(function->scope->ownerType)
		return ReportExpected(ctx, source, function->contextType, "ERROR: member function can't be called without a class instance");

	bool inFunctionScope = false;

	// Walk up, but if we reach a type owner, stop - we're not in a context of a function
	for(ScopeData *curr = ctx.scope; curr; curr = curr->scope)
	{
		if(curr->ownerType)
			break;

		if(curr->ownerFunction == function)
		{
			inFunctionScope = true;
			break;
		}
	}

	ExprBase *context = NULL;

	if(inFunctionScope)
	{
		context = CreateVariableAccess(ctx, source, function->contextArgument, true);
	}
	else if(ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(function->declaration))
	{
		if(definition->contextVariable)
		{
			VariableData *contextVariable = definition->contextVariable;

			context = CreateVariableAccess(ctx, source, contextVariable, true);

			if(ExprVariableAccess *access = getType<ExprVariableAccess>(context))
			{
				assert(access->variable == contextVariable);

				context = new (ctx.get<ExprFunctionContextAccess>()) ExprFunctionContextAccess(source, access->type, function, contextVariable);
			}
		}
		else
		{
			context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, function->contextType);
		}
	}
	else if(function->coroutine)
	{
		unsigned functionIndex = ctx.GetFunctionIndex(function);

		if(function->importModule)
			functionIndex = functionIndex - function->importModule->startingFunctionIndex + function->importModule->importedFunctionCount;

		InplaceStr contextVariableName = GetFunctionContextVariableName(ctx, function, functionIndex);

		if(VariableData *variable = LookupVariableByName(ctx, contextVariableName.hash()))
		{
			context = CreateVariableAccess(ctx, source, variable, true);

			if(ExprVariableAccess *access = getType<ExprVariableAccess>(context))
			{
				assert(access->variable == variable);

				context = new (ctx.get<ExprFunctionContextAccess>()) ExprFunctionContextAccess(source, access->type, function, variable);
			}
		}
		else
		{
			context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, function->contextType);
		}
	}
	else
	{
		context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, function->contextType);
	}

	return context;
}